

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O0

ze_result_t
zeGetRTASParallelOperationProcAddrTable
          (ze_api_version_t version,ze_rtas_parallel_operation_dditable_t *pDdiTable)

{
  ze_pfnRTASParallelOperationCreateExt_t p_Var1;
  ze_pfnRTASParallelOperationGetPropertiesExt_t p_Var2;
  ze_pfnRTASParallelOperationJoinExt_t p_Var3;
  ze_pfnRTASParallelOperationDestroyExt_t p_Var4;
  bool bVar5;
  long lVar6;
  bool bVar7;
  ze_result_t zVar8;
  size_type sVar9;
  vector<loader::driver_t,_std::allocator<loader::driver_t>_> *this;
  reference pdVar10;
  reference pvVar11;
  code *pcVar12;
  ze_rtas_parallel_operation_dditable_t dditable;
  ze_pfnGetRTASParallelOperationProcAddrTable_t getTable_2;
  ze_pfnGetRTASParallelOperationProcAddrTable_t getTable_1;
  ze_result_t getTableResult;
  ze_pfnGetRTASParallelOperationProcAddrTable_t getTable;
  driver_t *drv;
  iterator __end1;
  iterator __begin1;
  driver_vector_t *__range1;
  bool atLeastOneDriverValid;
  ze_result_t result;
  ze_rtas_parallel_operation_dditable_t *pDdiTable_local;
  ze_api_version_t version_local;
  
  sVar9 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                    ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                     (loader::context + 0x15e0));
  if (sVar9 == 0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else if (pDdiTable == (ze_rtas_parallel_operation_dditable_t *)0x0) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else if (*(int *)(loader::context + 0x15c0) < (int)version) {
    pDdiTable_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
  }
  else {
    bVar5 = false;
    this = (vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)(loader::context + 0x15e0)
    ;
    __end1 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::begin(this);
    drv = (driver_t *)std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::end(this);
    while (bVar7 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                                       *)&drv), bVar7) {
      pdVar10 = __gnu_cxx::
                __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
                ::operator*(&__end1);
      if ((pdVar10->initStatus == ZE_RESULT_SUCCESS) &&
         (pcVar12 = (code *)dlsym(pdVar10->handle,"zeGetRTASParallelOperationProcAddrTable"),
         pcVar12 != (code *)0x0)) {
        zVar8 = (*pcVar12)(version,&(pdVar10->dditable).ze.RTASParallelOperation);
        if (zVar8 == ZE_RESULT_SUCCESS) {
          bVar5 = true;
        }
        else {
          pdVar10->initStatus = zVar8;
        }
      }
      __gnu_cxx::
      __normal_iterator<loader::driver_t_*,_std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>_>
      ::operator++(&__end1);
    }
    if (bVar5) {
      __range1._4_4_ = ZE_RESULT_SUCCESS;
    }
    else {
      __range1._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
    }
    if (__range1._4_4_ == ZE_RESULT_SUCCESS) {
      sVar9 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::size
                        ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                         (loader::context + 0x15e0));
      if ((sVar9 < 2) && ((*(byte *)(loader::context + 0x1629) & 1) == 0)) {
        pvVar11 = std::vector<loader::driver_t,_std::allocator<loader::driver_t>_>::front
                            ((vector<loader::driver_t,_std::allocator<loader::driver_t>_> *)
                             (loader::context + 0x15e0));
        pDdiTable->pfnCreateExt = (pvVar11->dditable).ze.RTASParallelOperation.pfnCreateExt;
        pDdiTable->pfnGetPropertiesExt =
             (pvVar11->dditable).ze.RTASParallelOperation.pfnGetPropertiesExt;
        pDdiTable->pfnJoinExt = (pvVar11->dditable).ze.RTASParallelOperation.pfnJoinExt;
        pDdiTable->pfnDestroyExt = (pvVar11->dditable).ze.RTASParallelOperation.pfnDestroyExt;
      }
      else {
        pDdiTable->pfnCreateExt = loader::zeRTASParallelOperationCreateExt;
        pDdiTable->pfnGetPropertiesExt = loader::zeRTASParallelOperationGetPropertiesExt;
        pDdiTable->pfnJoinExt = loader::zeRTASParallelOperationJoinExt;
        pDdiTable->pfnDestroyExt = loader::zeRTASParallelOperationDestroyExt;
      }
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1618) != 0)) {
      pcVar12 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1618),
                              "zeGetRTASParallelOperationProcAddrTable");
      if (pcVar12 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      __range1._4_4_ = (*pcVar12)(version,pDdiTable);
    }
    if ((__range1._4_4_ == ZE_RESULT_SUCCESS) && (*(long *)(loader::context + 0x1620) != 0)) {
      pcVar12 = (code *)dlsym(*(undefined8 *)(loader::context + 0x1620),
                              "zeGetRTASParallelOperationProcAddrTable");
      if (pcVar12 == (code *)0x0) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
      }
      p_Var1 = pDdiTable->pfnCreateExt;
      p_Var2 = pDdiTable->pfnGetPropertiesExt;
      p_Var3 = pDdiTable->pfnJoinExt;
      p_Var4 = pDdiTable->pfnDestroyExt;
      __range1._4_4_ = (*pcVar12)((ze_rtas_parallel_operation_ext_handle_t)version);
      lVar6 = loader::context;
      *(ze_pfnRTASParallelOperationCreateExt_t *)(loader::context + 0x16a8) = p_Var1;
      *(ze_pfnRTASParallelOperationGetPropertiesExt_t *)(lVar6 + 0x16b0) = p_Var2;
      *(ze_pfnRTASParallelOperationJoinExt_t *)(lVar6 + 0x16b8) = p_Var3;
      *(ze_pfnRTASParallelOperationDestroyExt_t *)(lVar6 + 0x16c0) = p_Var4;
      if ((*(byte *)(loader::context + 0x1652) & 1) != 0) {
        __range1._4_4_ = (*pcVar12)((ze_rtas_parallel_operation_ext_handle_t)version);
      }
    }
    pDdiTable_local._4_4_ = __range1._4_4_;
  }
  return pDdiTable_local._4_4_;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetRTASParallelOperationProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_rtas_parallel_operation_dditable_t* pDdiTable///< [in,out] pointer to table of DDI function pointers
    )
{
    if( loader::context->zeDrivers.size() < 1 ) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if( loader::context->version < version )
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    bool atLeastOneDriverValid = false;
    // Load the device-driver DDI tables
    for( auto& drv : loader::context->zeDrivers )
    {
        if(drv.initStatus != ZE_RESULT_SUCCESS)
            continue;
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationProcAddrTable_t>(
            GET_FUNCTION_PTR( drv.handle, "zeGetRTASParallelOperationProcAddrTable") );
        if(!getTable) 
            continue; 
        auto getTableResult = getTable( version, &drv.dditable.ze.RTASParallelOperation);
        if(getTableResult == ZE_RESULT_SUCCESS) 
            atLeastOneDriverValid = true;
        else
            drv.initStatus = getTableResult;
    }

    if(!atLeastOneDriverValid)
        result = ZE_RESULT_ERROR_UNINITIALIZED;
    else
        result = ZE_RESULT_SUCCESS;

    if( ZE_RESULT_SUCCESS == result )
    {
        if( ( loader::context->zeDrivers.size() > 1 ) || loader::context->forceIntercept )
        {
            // return pointers to loader's DDIs
            pDdiTable->pfnCreateExt                                = loader::zeRTASParallelOperationCreateExt;
            pDdiTable->pfnGetPropertiesExt                         = loader::zeRTASParallelOperationGetPropertiesExt;
            pDdiTable->pfnJoinExt                                  = loader::zeRTASParallelOperationJoinExt;
            pDdiTable->pfnDestroyExt                               = loader::zeRTASParallelOperationDestroyExt;
        }
        else
        {
            // return pointers directly to driver's DDIs
            *pDdiTable = loader::context->zeDrivers.front().dditable.ze.RTASParallelOperation;
        }
    }

    // If the validation layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->validationLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->validationLayer, "zeGetRTASParallelOperationProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        result = getTable( version, pDdiTable );
    }

    // If the API tracing layer is enabled, then intercept the loader's DDIs
    if(( ZE_RESULT_SUCCESS == result ) && ( nullptr != loader::context->tracingLayer ))
    {
        auto getTable = reinterpret_cast<ze_pfnGetRTASParallelOperationProcAddrTable_t>(
            GET_FUNCTION_PTR(loader::context->tracingLayer, "zeGetRTASParallelOperationProcAddrTable") );
        if(!getTable)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        ze_rtas_parallel_operation_dditable_t dditable;
        memcpy(&dditable, pDdiTable, sizeof(ze_rtas_parallel_operation_dditable_t));
        result = getTable( version, &dditable );
        loader::context->tracing_dditable.ze.RTASParallelOperation = dditable;
        if ( loader::context->tracingLayerEnabled ) {
            result = getTable( version, pDdiTable );
        }
    }

    return result;
}